

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void poly1305_add(uint32_t *h,uint32_t *x)

{
  int local_20;
  uint local_1c;
  int i;
  uint32_t carry;
  uint32_t *x_local;
  uint32_t *h_local;
  
  local_1c = 0;
  for (local_20 = 0; local_20 < 0x11; local_20 = local_20 + 1) {
    local_1c = h[local_20] + x[local_20] + local_1c;
    h[local_20] = local_1c & 0xff;
    local_1c = local_1c >> 8;
  }
  return;
}

Assistant:

static void poly1305_add(uint32_t h[17],
                         const uint32_t x[17])
{
  uint32_t carry = 0;
  int i;

  for (i = 0; i < 17; i++)
  {
    carry += h[i] + x[i];
    h[i] = carry & 0xff;
    carry >>= 8;
  }
}